

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash_ssse3.c
# Opt level: O0

uint64_t siphash(uchar *key,uchar *m,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar61 [16];
  xmmi v02;
  xmmi k;
  ulong local_13d0;
  ulong local_13c0;
  undefined1 local_13b8 [16];
  undefined1 local_1388 [16];
  ulong local_1378;
  ulong uStack_1370;
  undefined1 local_1368 [16];
  ulong local_1328;
  ulong uStack_1320;
  ulong local_11e8;
  ulong uStack_11e0;
  ulong local_1128;
  ulong uStack_1120;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1028;
  ulong uStack_1020;
  size_t blocks;
  size_t i;
  uint32_t hi;
  uint32_t lo;
  uint64_t last7;
  xmmi mi;
  xmmi v33;
  xmmi v11;
  xmmi v13;
  xmmi v20;
  
  local_1368._0_8_ = siphash_init[0].u[0];
  local_1368._8_8_ = siphash_init[0].u[1];
  auVar61 = vpunpcklqdq_avx(*in_RDI,*in_RDI);
  local_1028 = auVar61._0_8_;
  uStack_1020 = auVar61._8_8_;
  local_1368._0_8_ = local_1368._0_8_ ^ local_1028;
  local_1368._8_8_ = local_1368._8_8_ ^ uStack_1020;
  local_1388._0_8_ = siphash_init[1].u[0];
  local_1388._8_8_ = siphash_init[1].u[1];
  auVar61 = vpunpckhqdq_avx(*in_RDI,*in_RDI);
  local_1048 = auVar61._0_8_;
  uStack_1040 = auVar61._8_8_;
  local_1388._0_8_ = local_1388._0_8_ ^ local_1048;
  local_1388._8_8_ = local_1388._8_8_ ^ uStack_1040;
  local_13c0 = in_RDX << 0x38;
  for (local_13d0 = 0; local_13d0 < (in_RDX & 0xfffffffffffffff8); local_13d0 = local_13d0 + 8) {
    local_13b8._8_8_ = 0;
    local_13b8._0_8_ = *(ulong *)(in_RSI + local_13d0);
    auVar61 = vpslldq_avx(local_13b8,8);
    local_1068 = auVar61._0_8_;
    uStack_1060 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1068;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1060;
    auVar1._8_8_ = local_1388._8_8_;
    auVar1._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar1,ZEXT416(0xd));
    auVar31._8_8_ = local_1388._8_8_;
    auVar31._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar31,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar50._8_8_ = local_1368._8_8_;
    auVar50._0_8_ = local_1368._0_8_;
    auVar49._8_8_ = local_1388._8_8_;
    auVar49._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar50,auVar49);
    auVar58._8_8_ = local_1388._8_8_;
    auVar58._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar58,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar3._8_8_ = local_1388._8_8_;
    auVar3._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar3,ZEXT416(0x11));
    auVar30._8_8_ = local_1388._8_8_;
    auVar30._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar30,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar48._8_8_ = local_1388._8_8_;
    auVar48._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar48);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    auVar61._8_8_ = local_1388._8_8_;
    auVar61._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar61,ZEXT416(0xd));
    auVar29._8_8_ = local_1388._8_8_;
    auVar29._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar29,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar47._8_8_ = local_1388._8_8_;
    auVar47._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar1,auVar47);
    auVar57._8_8_ = local_1388._8_8_;
    auVar57._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar57,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar2._8_8_ = local_1388._8_8_;
    auVar2._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar2,ZEXT416(0x11));
    auVar4._8_8_ = local_1388._8_8_;
    auVar4._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar4,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar46._8_8_ = local_1388._8_8_;
    auVar46._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar46);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar1._0_8_;
    local_1388._8_8_ = auVar1._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    local_1368._0_8_ = auVar2._0_8_;
    local_1368._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = local_1368._0_8_ ^ *(ulong *)(in_RSI + local_13d0);
  }
  switch(in_RDX - (in_RDX & 0xfffffffffffffff8)) {
  case 7:
    local_13c0 = (ulong)*(byte *)(in_RSI + 6 + local_13d0) << 0x30 | local_13c0;
  case 6:
    local_13c0 = (ulong)*(byte *)(in_RSI + 5 + local_13d0) << 0x28 | local_13c0;
  case 5:
    local_13c0 = (ulong)*(byte *)(in_RSI + 4 + local_13d0) << 0x20 | local_13c0;
  case 4:
    local_13c0 = (ulong)*(byte *)(in_RSI + 3 + local_13d0) << 0x18 | local_13c0;
  case 3:
    local_13c0 = (ulong)*(byte *)(in_RSI + 2 + local_13d0) << 0x10 | local_13c0;
  case 2:
    local_13c0 = (ulong)*(byte *)(in_RSI + 1 + local_13d0) << 8 | local_13c0;
  case 1:
    local_13c0 = *(byte *)(in_RSI + local_13d0) | local_13c0;
  case 0:
  default:
    i = local_13c0 & 0xffffffff;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = i;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_13c0 >> 0x20;
    auVar4 = vpunpckldq_avx(auVar60,auVar59);
    auVar61 = vpslldq_avx(auVar4,8);
    local_1128 = auVar61._0_8_;
    uStack_1120 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1128;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1120;
    auVar16._8_8_ = local_1388._8_8_;
    auVar16._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar16,ZEXT416(0xd));
    auVar28._8_8_ = local_1388._8_8_;
    auVar28._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar28,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar45._8_8_ = local_1368._8_8_;
    auVar45._0_8_ = local_1368._0_8_;
    auVar44._8_8_ = local_1388._8_8_;
    auVar44._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar45,auVar44);
    auVar56._8_8_ = local_1388._8_8_;
    auVar56._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar56,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar15._8_8_ = local_1388._8_8_;
    auVar15._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar15,ZEXT416(0x11));
    auVar27._8_8_ = local_1388._8_8_;
    auVar27._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar27,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar43._8_8_ = local_1388._8_8_;
    auVar43._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar43);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    auVar14._8_8_ = local_1388._8_8_;
    auVar14._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar14,ZEXT416(0xd));
    auVar26._8_8_ = local_1388._8_8_;
    auVar26._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar26,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar42._8_8_ = local_1388._8_8_;
    auVar42._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar1,auVar42);
    auVar55._8_8_ = local_1388._8_8_;
    auVar55._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar55,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar13._8_8_ = local_1388._8_8_;
    auVar13._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar13,ZEXT416(0x11));
    auVar25._8_8_ = local_1388._8_8_;
    auVar25._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar25,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar41._8_8_ = local_1388._8_8_;
    auVar41._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar41);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar1._0_8_;
    local_1388._8_8_ = auVar1._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    local_1368._0_8_ = auVar2._0_8_;
    local_1368._8_8_ = auVar2._8_8_;
    local_13b8._0_8_ = auVar4._0_8_;
    local_13b8._8_8_ = auVar4._8_8_;
    local_11e8 = siphash_final.u[0];
    uStack_11e0 = siphash_final.u[1];
    auVar12._8_8_ = local_1388._8_8_;
    auVar12._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar12,ZEXT416(0xd));
    auVar24._8_8_ = local_1388._8_8_;
    auVar24._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar24,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar40._8_8_ = local_1368._8_8_ ^ local_13b8._8_8_ ^ uStack_11e0;
    auVar40._0_8_ = local_1368._0_8_ ^ local_13b8._0_8_ ^ local_11e8;
    auVar39._8_8_ = local_1388._8_8_;
    auVar39._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar40,auVar39);
    auVar54._8_8_ = local_1388._8_8_;
    auVar54._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar54,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar11._8_8_ = local_1388._8_8_;
    auVar11._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar11,ZEXT416(0x11));
    auVar23._8_8_ = local_1388._8_8_;
    auVar23._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar23,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar38._8_8_ = local_1388._8_8_;
    auVar38._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar38);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    auVar10._8_8_ = local_1388._8_8_;
    auVar10._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar10,ZEXT416(0xd));
    auVar22._8_8_ = local_1388._8_8_;
    auVar22._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar22,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar37._8_8_ = local_1388._8_8_;
    auVar37._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar1,auVar37);
    auVar53._8_8_ = local_1388._8_8_;
    auVar53._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar53,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar9._8_8_ = local_1388._8_8_;
    auVar9._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar9,ZEXT416(0x11));
    auVar21._8_8_ = local_1388._8_8_;
    auVar21._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar21,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar36._8_8_ = local_1388._8_8_;
    auVar36._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar36);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    auVar8._8_8_ = local_1388._8_8_;
    auVar8._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar8,ZEXT416(0xd));
    auVar20._8_8_ = local_1388._8_8_;
    auVar20._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar20,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar35._8_8_ = local_1388._8_8_;
    auVar35._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar1,auVar35);
    auVar52._8_8_ = local_1388._8_8_;
    auVar52._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar52,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar7._8_8_ = local_1388._8_8_;
    auVar7._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar7,ZEXT416(0x11));
    auVar19._8_8_ = local_1388._8_8_;
    auVar19._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar19,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar34._8_8_ = local_1388._8_8_;
    auVar34._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar34);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1378;
    local_1388._8_8_ = local_1388._8_8_ ^ uStack_1370;
    auVar6._8_8_ = local_1388._8_8_;
    auVar6._0_8_ = local_1388._0_8_;
    auVar61 = vpsllq_avx(auVar6,ZEXT416(0xd));
    auVar18._8_8_ = local_1388._8_8_;
    auVar18._0_8_ = local_1388._0_8_;
    auVar2 = vpsrlq_avx(auVar18,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar61,auVar2);
    auVar33._8_8_ = local_1388._8_8_;
    auVar33._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar1,auVar33);
    auVar51._8_8_ = local_1388._8_8_;
    auVar51._0_8_ = local_1388._0_8_;
    auVar1 = vpshufb_avx(auVar51,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_1388._0_8_ = auVar2._0_8_;
    local_1388._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = auVar61._0_8_;
    local_1368._8_8_ = auVar61._8_8_;
    local_1388._0_8_ = local_1388._0_8_ ^ local_1368._0_8_;
    local_1388._8_8_ = local_1388._8_8_ ^ local_1368._8_8_;
    auVar61 = vpshufd_avx(auVar61,0x1e);
    auVar1 = vpshufd_avx(local_1388,0x4e);
    auVar5._8_8_ = local_1388._8_8_;
    auVar5._0_8_ = local_1388._0_8_;
    auVar2 = vpsllq_avx(auVar5,ZEXT416(0x11));
    auVar17._8_8_ = local_1388._8_8_;
    auVar17._0_8_ = local_1388._0_8_;
    auVar3 = vpsrlq_avx(auVar17,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar32._8_8_ = local_1388._8_8_;
    auVar32._0_8_ = local_1388._0_8_;
    auVar61 = vpaddq_avx(auVar61,auVar32);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar61,0x1e);
    local_1388._0_8_ = auVar1._0_8_;
    local_1388._8_8_ = auVar1._8_8_;
    local_1378 = auVar61._0_8_;
    uStack_1370 = auVar61._8_8_;
    local_1368._0_8_ = auVar2._0_8_;
    local_1368._8_8_ = auVar2._8_8_;
    local_1368._0_8_ = local_1368._0_8_ ^ local_1388._0_8_ ^ local_1378;
    local_1368._8_8_ = local_1368._8_8_ ^ local_1388._8_8_ ^ uStack_1370;
    auVar61 = vpshufd_avx(local_1368,0x4e);
    local_1328 = auVar61._0_8_;
    uStack_1320 = auVar61._8_8_;
    local_1368._0_8_ = local_1368._0_8_ ^ local_1328;
    local_1368._8_8_ = local_1368._8_8_ ^ uStack_1320;
    v11[1]._0_4_ = (undefined4)local_1368._0_8_;
    auVar61 = vpsrldq_avx(local_1368,4);
    mi[1]._0_4_ = auVar61._0_4_;
    return CONCAT44((undefined4)mi[1],(undefined4)v11[1]);
  }
}

Assistant:

uint64_t
siphash(const unsigned char key[16], const unsigned char *m, size_t len) {
	xmmi k,v02,v20,v13,v11,v33,mi;
	uint64_t last7;
	uint32_t lo, hi;
	size_t i, blocks;

	k = _mm_loadu_si128((xmmi *)(key + 0));
	v02 = siphash_init[0].v;
	v13 = siphash_init[1].v;
	v02 = _mm_xor_si128(v02, _mm_unpacklo_epi64(k, k));
	v13 = _mm_xor_si128(v13, _mm_unpackhi_epi64(k, k));

	last7 = (uint64_t)(len & 0xff) << 56;

#define sipcompress() \
	v11 = v13; \
	v33 = v13; \
	v11 = _mm_or_si128(_mm_slli_epi64(v11, 13), _mm_srli_epi64(v11, 64-13)); \
	v02 = _mm_add_epi64(v02, v13); \
	v33 = _mm_shuffle_epi8(v33, siphash_rot16v3.v); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v13 = _mm_xor_si128(v13, v02); \
	v20 = _mm_shuffle_epi32(v02, _MM_SHUFFLE(0,1,3,2)); \
	v11 = v13; \
	v33 = _mm_shuffle_epi32(v13, _MM_SHUFFLE(1,0,3,2)); \
	v11 = _mm_or_si128(_mm_slli_epi64(v11, 17), _mm_srli_epi64(v11, 64-17)); \
	v20 = _mm_add_epi64(v20, v13); \
	v33 = _mm_or_si128(_mm_slli_epi64(v33, 21), _mm_srli_epi64(v33, 64-21)); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v13 = _mm_unpacklo_epi64(v11, v33); \
	v02 = _mm_shuffle_epi32(v20, _MM_SHUFFLE(0,1,3,2)); \
	v13 = _mm_xor_si128(v13, v20);

	for (i = 0, blocks = (len & ~7); i < blocks; i += 8) {
		mi = _mm_loadl_epi64((xmmi *)(m + i));
		v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
		sipcompress()
		sipcompress()
		v02 = _mm_xor_si128(v02, mi);
	}

	switch (len - blocks) {
		case 7: last7 |= (uint64_t)m[i + 6] << 48;
		case 6: last7 |= (uint64_t)m[i + 5] << 40;
		case 5: last7 |= (uint64_t)m[i + 4] << 32;
		case 4: last7 |= (uint64_t)m[i + 3] << 24;
		case 3: last7 |= (uint64_t)m[i + 2] << 16;
		case 2: last7 |= (uint64_t)m[i + 1] <<  8;
		case 1: last7 |= (uint64_t)m[i + 0]      ;
		case 0:
		default:;
	};

	mi = _mm_unpacklo_epi32(_mm_cvtsi32_si128((uint32_t)last7),_mm_cvtsi32_si128((uint32_t)(last7 >> 32)));
	v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
	sipcompress()
	sipcompress()
	v02 = _mm_xor_si128(v02, mi);
	v02 = _mm_xor_si128(v02, siphash_final.v);
	sipcompress()
	sipcompress()
	sipcompress()
	sipcompress()

	v02 = _mm_xor_si128(v02, v13);
	v02 = _mm_xor_si128(v02, _mm_shuffle_epi32(v02, _MM_SHUFFLE(1,0,3,2)));
	lo = _mm_cvtsi128_si32(v02);
	hi = _mm_cvtsi128_si32(_mm_srli_si128(v02, 4));
	return ((uint64_t)hi << 32) | lo;
}